

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Image * vera::toLuma(Image *__return_storage_ptr__,Image *_image)

{
  int _width;
  int _height;
  int iVar1;
  undefined4 extraout_var;
  size_t _index;
  float _x;
  float _y;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 in_XMM1_Da;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 in_XMM1_Db;
  vec<3,_float,_(glm::qualifier)0> local_68;
  vec<3,_float,_(glm::qualifier)0> local_5c;
  float local_50;
  float value;
  vec4 c;
  int x;
  int y;
  int height;
  int width;
  Image *_image_local;
  Image *out;
  
  _width = (*_image->_vptr_Image[6])();
  _height = (*_image->_vptr_Image[7])();
  Image::Image(__return_storage_ptr__,_width,_height,1);
  for (c.field_3.w = 0.0; (int)c.field_3 < _height; c.field_3.w = c.field_3.w + 1) {
    for (c.field_2.z = 0.0; (int)c.field_2 < _width; c.field_2.z = c.field_2.z + 1) {
      iVar1 = (*_image->_vptr_Image[0xe])(_image,(long)(int)c.field_2,(long)(int)c.field_3);
      (*_image->_vptr_Image[0x19])(_image,CONCAT44(extraout_var,iVar1));
      c.field_1 = in_XMM1_Db;
      c.field_0.x = in_XMM1_Da.x;
      glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_5c,_x,_y,in_XMM1_Da.x);
      in_XMM1_Da.x = 0.7152;
      in_XMM1_Db.y = 0.0;
      glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_68,0.2126,0.7152,0.0722);
      local_50 = glm::dot<3,float,(glm::qualifier)0>(&local_5c,&local_68);
      _index = Image::getIndex(__return_storage_ptr__,(long)(int)c.field_2,(long)(int)c.field_3);
      Image::setValue(__return_storage_ptr__,_index,local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image toLuma(const Image& _image) {
    int width = _image.getWidth();
    int height = _image.getHeight();

    Image out = Image(width, height, 1);
    for (int y = 0; y < height; y++) {
        for (int x = 0; x < width; x++) {
            glm::vec4 c = _image.getColor( _image.getIndex(x, y) );
            float value = glm::dot(glm::vec3(c.x, c.y, c.z), glm::vec3(0.2126f, 0.7152f, 0.0722f));
            out.setValue( out.getIndex(x, y), value);
        }
    }

    return out;
}